

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_sse4.c
# Opt level: O0

void av1_highbd_dist_wtd_convolve_y_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params,
               int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  ulong uVar21;
  longlong lVar22;
  longlong lVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  long in_stack_00000008;
  int *in_stack_00000018;
  int in_stack_00000020;
  __m128i res_16bit1;
  __m128i res_16bit0;
  __m128i res_clip_1_1;
  __m128i res_16b_1_2;
  __m128i res_clip_0_1;
  __m128i res_16b_0_2;
  __m128i round_result_hi_1;
  __m128i round_result_hi_0;
  __m128i round_result_lo_1;
  __m128i round_result_lo_0;
  __m128i comp_avg_res_hi_1;
  __m128i comp_avg_res_hi_0;
  __m128i comp_avg_res_lo_1;
  __m128i comp_avg_res_lo_0;
  __m128i data_ref_0_hi_1;
  __m128i data_ref_0_hi_0;
  __m128i data_ref_0_lo_1;
  __m128i data_ref_0_lo_0;
  __m128i data_1_1;
  __m128i data_0_1;
  __m128i res_unsigned_hi_1;
  __m128i res_unsigned_hi_0;
  __m128i res_b_round1;
  __m128i res_b1;
  __m128i res_b_round0;
  __m128i res_b0;
  __m128i res_16b_1_1;
  __m128i res_16b_0_1;
  __m128i res_clip_1;
  __m128i res_16b_1;
  __m128i res_clip_0;
  __m128i res_16b_0;
  __m128i round_result_1;
  __m128i round_result_0;
  __m128i comp_avg_res_1;
  __m128i comp_avg_res_0;
  __m128i data_ref_1;
  __m128i data_ref_0;
  __m128i data_1;
  __m128i data_0;
  __m128i res_unsigned_lo_1;
  __m128i res_unsigned_lo_0;
  __m128i res_a_round1;
  __m128i res_a1;
  __m128i res_a_round0;
  __m128i res_a0;
  __m128i s8;
  __m128i s7;
  __m128i s6;
  __m128i s5;
  __m128i s4;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  uint16_t *data;
  __m128i coeffs_y [4];
  __m128i s [16];
  __m128i zero;
  __m128i clip_pixel_to_bd;
  __m128i rounding_const;
  int rounding_shift;
  __m128i offset_const;
  int offset;
  int offset_0;
  __m128i round_shift_bits;
  __m128i round_shift_y;
  __m128i round_const_y;
  __m128i wt1;
  __m128i wt0;
  int w1;
  int w0;
  int use_dist_wtd_comp_avg;
  int do_average;
  int j;
  int i;
  int bits;
  uint16_t *src_ptr;
  int fo_vert;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  __m128i *in_stack_fffffffffffff0f8;
  __m128i *offset_const_00;
  undefined8 in_stack_fffffffffffff100;
  __m128i *round_const;
  undefined2 in_stack_fffffffffffff108;
  undefined4 uVar30;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  longlong local_e48 [2];
  longlong local_e38 [2];
  longlong local_e28 [2];
  longlong local_e18 [2];
  undefined2 local_e08;
  undefined2 uStack_e06;
  undefined2 uStack_e04;
  undefined2 uStack_e02;
  undefined2 uStack_e00;
  undefined2 uStack_dfe;
  undefined2 uStack_dfc;
  undefined2 uStack_dfa;
  undefined2 local_df8;
  undefined2 uStack_df6;
  undefined2 uStack_df4;
  undefined2 uStack_df2;
  undefined2 uStack_df0;
  undefined2 uStack_dee;
  undefined2 uStack_dec;
  undefined2 uStack_dea;
  undefined2 local_de8;
  undefined2 uStack_de6;
  undefined2 uStack_de4;
  undefined2 uStack_de2;
  undefined2 uStack_de0;
  undefined2 uStack_dde;
  undefined2 uStack_ddc;
  undefined2 uStack_dda;
  undefined2 local_dd8;
  undefined2 uStack_dd6;
  undefined2 uStack_dd4;
  undefined2 uStack_dd2;
  undefined2 uStack_dd0;
  undefined2 uStack_dce;
  undefined2 uStack_dcc;
  undefined2 uStack_dca;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  int local_da8;
  int iStack_da4;
  int iStack_da0;
  int iStack_d9c;
  int local_d98;
  int iStack_d94;
  int iStack_d90;
  int iStack_d8c;
  int local_d88;
  int iStack_d84;
  int iStack_d80;
  int iStack_d7c;
  int local_d68;
  int iStack_d64;
  int iStack_d60;
  int iStack_d5c;
  undefined1 local_d48 [16];
  undefined1 local_d38 [16];
  ushort local_d28;
  ushort uStack_d26;
  ushort uStack_d24;
  ushort uStack_d22;
  ushort uStack_d20;
  ushort uStack_d1e;
  ushort uStack_d1c;
  ushort uStack_d1a;
  undefined1 local_d18 [16];
  ushort local_d08;
  ushort uStack_d06;
  ushort uStack_d04;
  ushort uStack_d02;
  ushort uStack_d00;
  ushort uStack_cfe;
  ushort uStack_cfc;
  ushort uStack_cfa;
  undefined1 local_cf8 [16];
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  longlong local_cc8 [2];
  longlong local_cb8 [2];
  undefined2 local_ca8;
  undefined2 uStack_ca6;
  undefined2 uStack_ca4;
  undefined2 uStack_ca2;
  undefined2 uStack_ca0;
  undefined2 uStack_c9e;
  undefined2 uStack_c9c;
  undefined2 uStack_c9a;
  undefined2 local_c98;
  undefined2 uStack_c96;
  undefined2 uStack_c94;
  undefined2 uStack_c92;
  undefined2 uStack_c90;
  undefined2 uStack_c8e;
  undefined2 uStack_c8c;
  undefined2 uStack_c8a;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  int local_c68;
  int iStack_c64;
  int iStack_c60;
  int iStack_c5c;
  int local_c58;
  int iStack_c54;
  int iStack_c50;
  int iStack_c4c;
  int local_c48;
  int iStack_c44;
  int iStack_c40;
  int iStack_c3c;
  int local_c28;
  int iStack_c24;
  int iStack_c20;
  int iStack_c1c;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  long local_b70;
  longlong local_b68 [8];
  longlong local_b28;
  undefined8 uStack_b20;
  longlong local_b18;
  undefined8 uStack_b10;
  longlong local_b08;
  undefined8 uStack_b00;
  undefined2 local_af8;
  undefined2 uStack_af6;
  undefined2 uStack_af4;
  undefined2 uStack_af2;
  undefined2 uStack_af0;
  undefined2 uStack_aee;
  undefined2 uStack_aec;
  undefined2 uStack_aea;
  longlong local_ae8;
  undefined8 uStack_ae0;
  longlong local_ad8;
  undefined8 uStack_ad0;
  longlong local_ac8;
  undefined8 uStack_ac0;
  undefined2 local_ab8;
  undefined2 uStack_ab6;
  undefined2 uStack_ab4;
  undefined2 uStack_ab2;
  undefined2 uStack_ab0;
  undefined2 uStack_aae;
  undefined2 uStack_aac;
  undefined2 uStack_aaa;
  longlong local_aa8;
  undefined8 uStack_aa0;
  longlong local_a98;
  undefined8 uStack_a90;
  longlong local_a88;
  undefined8 uStack_a80;
  undefined2 local_a78;
  undefined2 uStack_a76;
  undefined2 uStack_a74;
  undefined2 uStack_a72;
  undefined2 uStack_a70;
  undefined2 uStack_a6e;
  undefined2 uStack_a6c;
  undefined2 uStack_a6a;
  longlong local_a68;
  undefined8 uStack_a60;
  longlong local_a58;
  undefined8 uStack_a50;
  longlong local_a48;
  undefined8 uStack_a40;
  undefined2 local_a38;
  undefined2 uStack_a36;
  undefined2 uStack_a34;
  undefined2 uStack_a32;
  undefined2 uStack_a30;
  undefined2 uStack_a2e;
  undefined2 uStack_a2c;
  undefined2 uStack_a2a;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  longlong local_a08;
  longlong lStack_a00;
  int local_9ec;
  longlong local_9e8;
  longlong lStack_9e0;
  int local_9d0;
  int local_9cc;
  ulong local_9c8;
  undefined8 uStack_9c0;
  ulong local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  longlong local_998;
  longlong lStack_990;
  longlong local_988;
  longlong lStack_980;
  int local_96c;
  int local_968;
  int local_964;
  int local_960;
  int local_95c;
  int local_958;
  uint local_954;
  long local_950;
  int local_948;
  int local_944;
  long local_940;
  int local_934;
  int local_930;
  int local_92c;
  long local_928;
  int local_91c;
  int local_90c;
  int local_908;
  int local_904;
  int local_900;
  int local_8fc;
  undefined1 local_8f8 [16];
  uint local_8dc;
  undefined1 local_8d8 [16];
  uint local_8c0;
  undefined2 local_8ba;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 *local_8a0;
  undefined8 *local_898;
  undefined8 *local_890;
  undefined8 *local_888;
  undefined8 *local_880;
  undefined8 *local_878;
  undefined8 *local_870;
  undefined8 *local_868;
  undefined8 *local_860;
  undefined8 *local_858;
  undefined8 *local_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  int local_578;
  int iStack_574;
  int iStack_570;
  int iStack_56c;
  undefined8 local_568;
  undefined8 uStack_560;
  int local_558;
  int iStack_554;
  int iStack_550;
  int iStack_54c;
  undefined8 local_548;
  undefined8 uStack_540;
  int local_538;
  int iStack_534;
  int iStack_530;
  int iStack_52c;
  undefined8 local_528;
  undefined8 uStack_520;
  int local_518;
  int iStack_514;
  int iStack_510;
  int iStack_50c;
  ulong local_508;
  undefined8 uStack_500;
  int local_4f8;
  int iStack_4f4;
  int iStack_4f0;
  int iStack_4ec;
  ulong local_4e8;
  undefined8 uStack_4e0;
  int local_4d8;
  int iStack_4d4;
  int iStack_4d0;
  int iStack_4cc;
  ulong local_4c8;
  undefined8 uStack_4c0;
  int local_4b8;
  int iStack_4b4;
  int iStack_4b0;
  int iStack_4ac;
  ulong local_4a8;
  undefined8 uStack_4a0;
  int local_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  longlong local_488;
  longlong lStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  longlong local_408;
  longlong lStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  longlong local_c8;
  longlong lStack_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  longlong local_a8;
  longlong lStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  longlong local_68;
  longlong lStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  longlong local_48;
  longlong lStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_940 = *(long *)(in_stack_00000018 + 2);
  local_944 = in_stack_00000018[4];
  local_948 = (*(ushort *)(in_stack_00000008 + 8) >> 1) - 1;
  local_950 = in_RDI + (long)(local_948 * in_ESI) * -2;
  local_954 = 7 - in_stack_00000018[5];
  local_960 = *in_stack_00000018;
  local_964 = in_stack_00000018[9];
  local_968 = in_stack_00000018[10];
  local_96c = in_stack_00000018[0xb];
  local_988 = CONCAT44(local_968,local_968);
  lStack_980 = CONCAT44(local_968,local_968);
  local_998 = CONCAT44(local_96c,local_96c);
  lStack_990 = CONCAT44(local_96c,local_96c);
  local_904 = (1 << (*(byte *)(in_stack_00000018 + 6) & 0x1f)) >> 1;
  local_9a8 = CONCAT44(local_904,local_904);
  uStack_9a0 = CONCAT44(local_904,local_904);
  local_8c0 = in_stack_00000018[6];
  local_8d8._4_4_ = 0;
  local_8d8._0_4_ = local_8c0;
  local_9b8 = local_8d8._0_8_;
  uStack_9b0 = 0;
  local_8f8._4_4_ = 0;
  local_8f8._0_4_ = local_954;
  local_9c8 = local_8f8._0_8_;
  uStack_9c0 = 0;
  local_9cc = ((in_stack_00000020 - in_stack_00000018[5]) - in_stack_00000018[6]) + 0xe;
  local_9d0 = (1 << ((byte)local_9cc & 0x1f)) + (1 << ((byte)local_9cc - 1 & 0x1f));
  local_9e8 = CONCAT44(local_9d0,local_9d0);
  lStack_9e0 = CONCAT44(local_9d0,local_9d0);
  local_9ec = 0xe - (in_stack_00000018[5] + in_stack_00000018[6]);
  local_90c = (1 << ((byte)local_9ec & 0x1f)) >> 1;
  local_a08 = CONCAT44(local_90c,local_90c);
  lStack_a00 = CONCAT44(local_90c,local_90c);
  if (in_stack_00000020 == 10) {
    uVar30 = 0x3ff;
  }
  else {
    uVar30 = 0xff;
    if (in_stack_00000020 == 0xc) {
      uVar30 = 0xfff;
    }
  }
  local_8ba = (undefined2)uVar30;
  local_a18 = CONCAT26(local_8ba,CONCAT24(local_8ba,CONCAT22(local_8ba,local_8ba)));
  uStack_a10 = CONCAT26(local_8ba,CONCAT24(local_8ba,CONCAT22(local_8ba,local_8ba)));
  local_8b8 = 0;
  uStack_8b0 = 0;
  local_a28 = 0;
  uStack_a20 = 0;
  local_934 = in_R9D;
  local_930 = in_R8D;
  local_92c = in_ECX;
  local_928 = in_RDX;
  local_91c = in_ESI;
  local_908 = local_9d0;
  local_900 = local_96c;
  local_8fc = local_968;
  local_8f8 = ZEXT416(local_954);
  local_8dc = local_954;
  local_8d8 = ZEXT416(local_8c0);
  local_c8 = local_988;
  lStack_c0 = lStack_980;
  local_b8 = local_968;
  local_b4 = local_968;
  local_b0 = local_968;
  local_ac = local_968;
  local_a8 = local_998;
  lStack_a0 = lStack_990;
  local_98 = local_96c;
  local_94 = local_96c;
  local_90 = local_96c;
  local_8c = local_96c;
  local_88 = local_9a8;
  uStack_80 = uStack_9a0;
  local_78 = local_904;
  local_74 = local_904;
  local_70 = local_904;
  local_6c = local_904;
  local_68 = local_9e8;
  lStack_60 = lStack_9e0;
  local_58 = local_9d0;
  local_54 = local_9d0;
  local_50 = local_9d0;
  local_4c = local_9d0;
  local_48 = local_a08;
  lStack_40 = lStack_a00;
  local_38 = local_90c;
  local_34 = local_90c;
  local_30 = local_90c;
  local_2c = local_90c;
  local_28 = local_a18;
  uStack_20 = uStack_a10;
  local_10 = local_8ba;
  local_e = local_8ba;
  local_c = local_8ba;
  local_a = local_8ba;
  local_8 = local_8ba;
  local_6 = local_8ba;
  local_4 = local_8ba;
  local_2 = local_8ba;
  prepare_coeffs((InterpFilterParams *)
                 CONCAT44(uVar30,CONCAT22(local_8ba,in_stack_fffffffffffff108)),
                 (int)((ulong)in_stack_fffffffffffff100 >> 0x20),in_stack_fffffffffffff0f8);
  for (local_95c = 0; local_95c < local_930; local_95c = local_95c + 8) {
    local_850 = (undefined8 *)(local_950 + (long)local_95c * 2);
    local_b88 = *local_850;
    uStack_b80 = local_850[1];
    local_858 = (undefined8 *)((long)local_850 + (long)local_91c * 2);
    local_b98 = *local_858;
    uStack_b90 = local_858[1];
    local_860 = (undefined8 *)((long)local_850 + (long)(local_91c * 2) * 2);
    local_ba8 = *local_860;
    uStack_ba0 = local_860[1];
    local_868 = (undefined8 *)((long)local_850 + (long)(local_91c * 3) * 2);
    local_bb8 = *local_868;
    uStack_bb0 = local_868[1];
    local_870 = (undefined8 *)((long)local_850 + (long)(local_91c << 2) * 2);
    local_bc8 = *local_870;
    uStack_bc0 = local_870[1];
    local_878 = (undefined8 *)((long)local_850 + (long)(local_91c * 5) * 2);
    local_bd8 = *local_878;
    uStack_bd0 = local_878[1];
    local_880 = (undefined8 *)((long)local_850 + (long)(local_91c * 6) * 2);
    local_be8 = *local_880;
    uStack_be0 = local_880[1];
    local_6d8._2_2_ = (undefined2)((ulong)local_b88 >> 0x10);
    local_6d8._4_2_ = (undefined2)((ulong)local_b88 >> 0x20);
    local_6d8._6_2_ = (undefined2)((ulong)local_b88 >> 0x30);
    local_6e8._0_2_ = (undefined2)local_b98;
    local_6e8._2_2_ = (undefined2)((ulong)local_b98 >> 0x10);
    local_6e8._4_2_ = (undefined2)((ulong)local_b98 >> 0x20);
    local_6e8._6_2_ = (undefined2)((ulong)local_b98 >> 0x30);
    local_b28 = CONCAT26(local_6e8._2_2_,
                         CONCAT24(local_6d8._2_2_,CONCAT22((undefined2)local_6e8,(short)local_b88)))
    ;
    uStack_b20 = CONCAT26(local_6e8._6_2_,
                          CONCAT24(local_6d8._6_2_,CONCAT22(local_6e8._4_2_,local_6d8._4_2_)));
    local_6f8._2_2_ = (undefined2)((ulong)local_ba8 >> 0x10);
    local_6f8._4_2_ = (undefined2)((ulong)local_ba8 >> 0x20);
    local_6f8._6_2_ = (undefined2)((ulong)local_ba8 >> 0x30);
    local_708._0_2_ = (undefined2)local_bb8;
    local_708._2_2_ = (undefined2)((ulong)local_bb8 >> 0x10);
    local_708._4_2_ = (undefined2)((ulong)local_bb8 >> 0x20);
    local_708._6_2_ = (undefined2)((ulong)local_bb8 >> 0x30);
    local_b18 = CONCAT26(local_708._2_2_,
                         CONCAT24(local_6f8._2_2_,CONCAT22((undefined2)local_708,(short)local_ba8)))
    ;
    uStack_b10 = CONCAT26(local_708._6_2_,
                          CONCAT24(local_6f8._6_2_,CONCAT22(local_708._4_2_,local_6f8._4_2_)));
    local_718._2_2_ = (undefined2)((ulong)local_bc8 >> 0x10);
    local_718._4_2_ = (undefined2)((ulong)local_bc8 >> 0x20);
    local_718._6_2_ = (undefined2)((ulong)local_bc8 >> 0x30);
    local_728._0_2_ = (undefined2)local_bd8;
    local_728._2_2_ = (undefined2)((ulong)local_bd8 >> 0x10);
    local_728._4_2_ = (undefined2)((ulong)local_bd8 >> 0x20);
    local_728._6_2_ = (undefined2)((ulong)local_bd8 >> 0x30);
    local_b08 = CONCAT26(local_728._2_2_,
                         CONCAT24(local_718._2_2_,CONCAT22((undefined2)local_728,(short)local_bc8)))
    ;
    uStack_b00 = CONCAT26(local_728._6_2_,
                          CONCAT24(local_718._6_2_,CONCAT22(local_728._4_2_,local_718._4_2_)));
    uStack_590._2_2_ = (undefined2)((ulong)uStack_b80 >> 0x10);
    uStack_590._4_2_ = (undefined2)((ulong)uStack_b80 >> 0x20);
    uStack_590._6_2_ = (undefined2)((ulong)uStack_b80 >> 0x30);
    uStack_5a0._0_2_ = (undefined2)uStack_b90;
    uStack_5a0._2_2_ = (undefined2)((ulong)uStack_b90 >> 0x10);
    uStack_5a0._4_2_ = (undefined2)((ulong)uStack_b90 >> 0x20);
    uStack_5a0._6_2_ = (undefined2)((ulong)uStack_b90 >> 0x30);
    local_ae8 = CONCAT26(uStack_5a0._2_2_,
                         CONCAT24(uStack_590._2_2_,
                                  CONCAT22((undefined2)uStack_5a0,(short)uStack_b80)));
    uStack_ae0 = CONCAT26(uStack_5a0._6_2_,
                          CONCAT24(uStack_590._6_2_,CONCAT22(uStack_5a0._4_2_,uStack_590._4_2_)));
    uStack_5b0._2_2_ = (undefined2)((ulong)uStack_ba0 >> 0x10);
    uStack_5b0._4_2_ = (undefined2)((ulong)uStack_ba0 >> 0x20);
    uStack_5b0._6_2_ = (undefined2)((ulong)uStack_ba0 >> 0x30);
    uStack_5c0._0_2_ = (undefined2)uStack_bb0;
    uStack_5c0._2_2_ = (undefined2)((ulong)uStack_bb0 >> 0x10);
    uStack_5c0._4_2_ = (undefined2)((ulong)uStack_bb0 >> 0x20);
    uStack_5c0._6_2_ = (undefined2)((ulong)uStack_bb0 >> 0x30);
    local_ad8 = CONCAT26(uStack_5c0._2_2_,
                         CONCAT24(uStack_5b0._2_2_,
                                  CONCAT22((undefined2)uStack_5c0,(short)uStack_ba0)));
    uStack_ad0 = CONCAT26(uStack_5c0._6_2_,
                          CONCAT24(uStack_5b0._6_2_,CONCAT22(uStack_5c0._4_2_,uStack_5b0._4_2_)));
    uStack_5d0._2_2_ = (undefined2)((ulong)uStack_bc0 >> 0x10);
    uStack_5d0._4_2_ = (undefined2)((ulong)uStack_bc0 >> 0x20);
    uStack_5d0._6_2_ = (undefined2)((ulong)uStack_bc0 >> 0x30);
    uStack_5e0._0_2_ = (undefined2)uStack_bd0;
    uStack_5e0._2_2_ = (undefined2)((ulong)uStack_bd0 >> 0x10);
    uStack_5e0._4_2_ = (undefined2)((ulong)uStack_bd0 >> 0x20);
    uStack_5e0._6_2_ = (undefined2)((ulong)uStack_bd0 >> 0x30);
    local_ac8 = CONCAT26(uStack_5e0._2_2_,
                         CONCAT24(uStack_5d0._2_2_,
                                  CONCAT22((undefined2)uStack_5e0,(short)uStack_bc0)));
    uStack_ac0 = CONCAT26(uStack_5e0._6_2_,
                          CONCAT24(uStack_5d0._6_2_,CONCAT22(uStack_5e0._4_2_,uStack_5d0._4_2_)));
    local_aa8 = CONCAT26(local_6f8._2_2_,
                         CONCAT24(local_6e8._2_2_,CONCAT22((short)local_ba8,(undefined2)local_6e8)))
    ;
    uStack_aa0 = CONCAT26(local_6f8._6_2_,
                          CONCAT24(local_6e8._6_2_,CONCAT22(local_6f8._4_2_,local_6e8._4_2_)));
    local_a98 = CONCAT26(local_718._2_2_,
                         CONCAT24(local_708._2_2_,CONCAT22((short)local_bc8,(undefined2)local_708)))
    ;
    uStack_a90 = CONCAT26(local_718._6_2_,
                          CONCAT24(local_708._6_2_,CONCAT22(local_718._4_2_,local_708._4_2_)));
    local_788._0_2_ = (undefined2)local_be8;
    local_788._2_2_ = (undefined2)((ulong)local_be8 >> 0x10);
    local_788._4_2_ = (undefined2)((ulong)local_be8 >> 0x20);
    local_788._6_2_ = (undefined2)((ulong)local_be8 >> 0x30);
    local_a88 = CONCAT26(local_788._2_2_,
                         CONCAT24(local_728._2_2_,
                                  CONCAT22((undefined2)local_788,(undefined2)local_728)));
    uStack_a80 = CONCAT26(local_788._6_2_,
                          CONCAT24(local_728._6_2_,CONCAT22(local_788._4_2_,local_728._4_2_)));
    local_a68 = CONCAT26(uStack_5b0._2_2_,
                         CONCAT24(uStack_5a0._2_2_,
                                  CONCAT22((short)uStack_ba0,(undefined2)uStack_5a0)));
    uStack_a60 = CONCAT26(uStack_5b0._6_2_,
                          CONCAT24(uStack_5a0._6_2_,CONCAT22(uStack_5b0._4_2_,uStack_5a0._4_2_)));
    local_a58 = CONCAT26(uStack_5d0._2_2_,
                         CONCAT24(uStack_5c0._2_2_,
                                  CONCAT22((short)uStack_bc0,(undefined2)uStack_5c0)));
    uStack_a50 = CONCAT26(uStack_5d0._6_2_,
                          CONCAT24(uStack_5c0._6_2_,CONCAT22(uStack_5d0._4_2_,uStack_5c0._4_2_)));
    uStack_640._0_2_ = (undefined2)uStack_be0;
    uStack_640._2_2_ = (undefined2)((ulong)uStack_be0 >> 0x10);
    uStack_640._4_2_ = (undefined2)((ulong)uStack_be0 >> 0x20);
    uStack_640._6_2_ = (undefined2)((ulong)uStack_be0 >> 0x30);
    local_a48 = CONCAT26(uStack_640._2_2_,
                         CONCAT24(uStack_5e0._2_2_,
                                  CONCAT22((undefined2)uStack_640,(undefined2)uStack_5e0)));
    uStack_a40 = CONCAT26(uStack_640._6_2_,
                          CONCAT24(uStack_5e0._6_2_,CONCAT22(uStack_640._4_2_,uStack_5e0._4_2_)));
    local_788 = local_be8;
    uStack_780 = uStack_be0;
    local_778 = local_bd8;
    uStack_770 = uStack_bd0;
    local_768 = local_bc8;
    uStack_760 = uStack_bc0;
    local_758 = local_bb8;
    uStack_750 = uStack_bb0;
    local_748 = local_ba8;
    uStack_740 = uStack_ba0;
    local_738 = local_b98;
    uStack_730 = uStack_b90;
    local_728 = local_bd8;
    uStack_720 = uStack_bd0;
    local_718 = local_bc8;
    uStack_710 = uStack_bc0;
    local_708 = local_bb8;
    uStack_700 = uStack_bb0;
    local_6f8 = local_ba8;
    uStack_6f0 = uStack_ba0;
    local_6e8 = local_b98;
    uStack_6e0 = uStack_b90;
    local_6d8 = local_b88;
    uStack_6d0 = uStack_b80;
    local_648 = local_be8;
    uStack_640 = uStack_be0;
    local_638 = local_bd8;
    uStack_630 = uStack_bd0;
    local_628 = local_bc8;
    uStack_620 = uStack_bc0;
    local_618 = local_bb8;
    uStack_610 = uStack_bb0;
    local_608 = local_ba8;
    uStack_600 = uStack_ba0;
    local_5f8 = local_b98;
    uStack_5f0 = uStack_b90;
    local_5e8 = local_bd8;
    uStack_5e0 = uStack_bd0;
    local_5d8 = local_bc8;
    uStack_5d0 = uStack_bc0;
    local_5c8 = local_bb8;
    uStack_5c0 = uStack_bb0;
    local_5b8 = local_ba8;
    uStack_5b0 = uStack_ba0;
    local_5a8 = local_b98;
    uStack_5a0 = uStack_b90;
    local_598 = local_b88;
    uStack_590 = uStack_b80;
    for (local_958 = 0; local_958 < local_934; local_958 = local_958 + 2) {
      local_b70 = local_950 + (long)(local_958 * local_91c + local_95c) * 2;
      local_888 = (undefined8 *)(local_b70 + (long)(local_91c * 7) * 2);
      local_bf8 = *local_888;
      uStack_bf0 = local_888[1];
      local_890 = (undefined8 *)(local_b70 + (long)(local_91c << 3) * 2);
      local_c08 = *local_890;
      uStack_c00 = local_890[1];
      local_798 = local_be8;
      uVar19 = local_798;
      uStack_790 = uStack_be0;
      local_798._0_2_ = (undefined2)local_be8;
      local_798._2_2_ = (undefined2)((ulong)local_be8 >> 0x10);
      local_798._4_2_ = (undefined2)((ulong)local_be8 >> 0x20);
      local_798._6_2_ = (undefined2)((ulong)local_be8 >> 0x30);
      local_7a8._0_2_ = (undefined2)local_bf8;
      local_7a8._2_2_ = (undefined2)((ulong)local_bf8 >> 0x10);
      local_7a8._4_2_ = (undefined2)((ulong)local_bf8 >> 0x20);
      local_7a8._6_2_ = (undefined2)((ulong)local_bf8 >> 0x30);
      local_af8 = (undefined2)local_798;
      uStack_af6 = (undefined2)local_7a8;
      uStack_af4 = local_798._2_2_;
      uStack_af2 = local_7a8._2_2_;
      uStack_af0 = local_798._4_2_;
      uStack_aee = local_7a8._4_2_;
      uStack_aec = local_798._6_2_;
      uStack_aea = local_7a8._6_2_;
      local_658 = local_be8;
      uStack_650 = uStack_be0;
      uVar20 = uStack_650;
      uStack_650._0_2_ = (undefined2)uStack_be0;
      uStack_650._2_2_ = (undefined2)((ulong)uStack_be0 >> 0x10);
      uStack_650._4_2_ = (undefined2)((ulong)uStack_be0 >> 0x20);
      uStack_650._6_2_ = (undefined2)((ulong)uStack_be0 >> 0x30);
      uStack_660._0_2_ = (undefined2)uStack_bf0;
      uStack_660._2_2_ = (undefined2)((ulong)uStack_bf0 >> 0x10);
      uStack_660._4_2_ = (undefined2)((ulong)uStack_bf0 >> 0x20);
      uStack_660._6_2_ = (undefined2)((ulong)uStack_bf0 >> 0x30);
      local_ab8 = (undefined2)uStack_650;
      uStack_ab6 = (undefined2)uStack_660;
      uStack_ab4 = uStack_650._2_2_;
      uStack_ab2 = uStack_660._2_2_;
      uStack_ab0 = uStack_650._4_2_;
      uStack_aae = uStack_660._4_2_;
      uStack_aac = uStack_650._6_2_;
      uStack_aaa = uStack_660._6_2_;
      local_7c8._0_2_ = (undefined2)local_c08;
      local_7c8._2_2_ = (undefined2)((ulong)local_c08 >> 0x10);
      local_7c8._4_2_ = (undefined2)((ulong)local_c08 >> 0x20);
      local_7c8._6_2_ = (undefined2)((ulong)local_c08 >> 0x30);
      local_a78 = (undefined2)local_7a8;
      uStack_a76 = (undefined2)local_7c8;
      uStack_a74 = local_7a8._2_2_;
      uStack_a72 = local_7c8._2_2_;
      uStack_a70 = local_7a8._4_2_;
      uStack_a6e = local_7c8._4_2_;
      uStack_a6c = local_7a8._6_2_;
      uStack_a6a = local_7c8._6_2_;
      uStack_680._0_2_ = (undefined2)uStack_c00;
      uStack_680._2_2_ = (undefined2)((ulong)uStack_c00 >> 0x10);
      uStack_680._4_2_ = (undefined2)((ulong)uStack_c00 >> 0x20);
      uStack_680._6_2_ = (undefined2)((ulong)uStack_c00 >> 0x30);
      local_a38 = (undefined2)uStack_660;
      uStack_a36 = (undefined2)uStack_680;
      uStack_a34 = uStack_660._2_2_;
      uStack_a32 = uStack_680._2_2_;
      uStack_a30 = uStack_660._4_2_;
      uStack_a2e = uStack_680._4_2_;
      uStack_a2c = uStack_660._6_2_;
      uStack_a2a = uStack_680._6_2_;
      local_7c8 = local_c08;
      uStack_7c0 = uStack_c00;
      local_7b8 = local_bf8;
      uStack_7b0 = uStack_bf0;
      local_7a8 = local_bf8;
      uStack_7a0 = uStack_bf0;
      local_798 = uVar19;
      local_688 = local_c08;
      uStack_680 = uStack_c00;
      local_678 = local_bf8;
      uStack_670 = uStack_bf0;
      local_668 = local_bf8;
      uStack_660 = uStack_bf0;
      uStack_650 = uVar20;
      convolve((__m128i *)&local_b28,(__m128i *)local_b68);
      local_528 = local_9c8;
      uVar21 = local_528;
      uStack_520 = uStack_9c0;
      uVar19 = uStack_520;
      local_518 = (int)extraout_XMM0_Qa;
      iStack_514 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
      iStack_510 = (int)extraout_XMM0_Qb;
      iStack_50c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
      local_528._0_4_ = (int)local_9c8;
      local_528._4_4_ = (int)(local_9c8 >> 0x20);
      uStack_520._0_4_ = (int)uStack_9c0;
      uStack_520._4_4_ = (int)((ulong)uStack_9c0 >> 0x20);
      local_398 = CONCAT44(iStack_514 << local_528._4_4_,local_518 << (int)local_528);
      uStack_390 = CONCAT44(iStack_50c << uStack_520._4_4_,iStack_510 << (int)uStack_520);
      local_3a8 = local_9a8;
      uVar20 = local_3a8;
      uStack_3a0 = uStack_9a0;
      uVar24 = uStack_3a0;
      local_3a8._0_4_ = (int)local_9a8;
      local_3a8._4_4_ = (int)((ulong)local_9a8 >> 0x20);
      uStack_3a0._0_4_ = (int)uStack_9a0;
      uStack_3a0._4_4_ = (int)((ulong)uStack_9a0 >> 0x20);
      local_498 = (local_518 << (int)local_528) + (int)local_3a8;
      iStack_494 = (iStack_514 << local_528._4_4_) + local_3a8._4_4_;
      iStack_490 = (iStack_510 << (int)uStack_520) + (int)uStack_3a0;
      iStack_48c = (iStack_50c << uStack_520._4_4_) + uStack_3a0._4_4_;
      local_4a8 = local_9b8;
      uStack_4a0 = uStack_9b0;
      auVar29._8_8_ = uStack_9b0;
      auVar29._0_8_ = local_9b8;
      local_c28 = local_498 >> auVar29;
      iStack_c24 = iStack_494 >> auVar29;
      iStack_c20 = iStack_490 >> auVar29;
      iStack_c1c = iStack_48c >> auVar29;
      local_528 = uVar21;
      uStack_520 = uVar19;
      local_3a8 = uVar20;
      uStack_3a0 = uVar24;
      convolve((__m128i *)&local_aa8,(__m128i *)local_b68);
      local_548 = local_9c8;
      uVar21 = local_548;
      uStack_540 = uStack_9c0;
      uVar19 = uStack_540;
      local_538 = (int)extraout_XMM0_Qa_00;
      iStack_534 = (int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      iStack_530 = (int)extraout_XMM0_Qb_00;
      iStack_52c = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      local_548._0_4_ = (int)local_9c8;
      local_548._4_4_ = (int)(local_9c8 >> 0x20);
      uStack_540._0_4_ = (int)uStack_9c0;
      uStack_540._4_4_ = (int)((ulong)uStack_9c0 >> 0x20);
      local_3b8 = CONCAT44(iStack_534 << local_548._4_4_,local_538 << (int)local_548);
      uStack_3b0 = CONCAT44(iStack_52c << uStack_540._4_4_,iStack_530 << (int)uStack_540);
      local_3c8 = local_9a8;
      uVar20 = local_3c8;
      uStack_3c0 = uStack_9a0;
      uVar24 = uStack_3c0;
      local_3c8._0_4_ = (int)local_9a8;
      local_3c8._4_4_ = (int)((ulong)local_9a8 >> 0x20);
      uStack_3c0._0_4_ = (int)uStack_9a0;
      uStack_3c0._4_4_ = (int)((ulong)uStack_9a0 >> 0x20);
      local_4b8 = (local_538 << (int)local_548) + (int)local_3c8;
      iStack_4b4 = (iStack_534 << local_548._4_4_) + local_3c8._4_4_;
      iStack_4b0 = (iStack_530 << (int)uStack_540) + (int)uStack_3c0;
      iStack_4ac = (iStack_52c << uStack_540._4_4_) + uStack_3c0._4_4_;
      local_4c8 = local_9b8;
      uStack_4c0 = uStack_9b0;
      auVar28._8_8_ = uStack_9b0;
      auVar28._0_8_ = local_9b8;
      local_c48 = local_4b8 >> auVar28;
      iStack_c44 = iStack_4b4 >> auVar28;
      iStack_c40 = iStack_4b0 >> auVar28;
      iStack_c3c = iStack_4ac >> auVar28;
      local_3d8 = CONCAT44(iStack_c24,local_c28);
      uStack_3d0 = CONCAT44(iStack_c1c,iStack_c20);
      local_3e8 = local_9e8;
      lVar22 = local_3e8;
      uStack_3e0 = lStack_9e0;
      lVar23 = uStack_3e0;
      local_3e8._0_4_ = (int)local_9e8;
      local_3e8._4_4_ = (int)((ulong)local_9e8 >> 0x20);
      uStack_3e0._0_4_ = (int)lStack_9e0;
      uStack_3e0._4_4_ = (int)((ulong)lStack_9e0 >> 0x20);
      local_c58 = local_c28 + (int)local_3e8;
      iStack_c54 = iStack_c24 + local_3e8._4_4_;
      iStack_c50 = iStack_c20 + (int)uStack_3e0;
      iStack_c4c = iStack_c1c + uStack_3e0._4_4_;
      local_3f8 = CONCAT44(iStack_c44,local_c48);
      uStack_3f0 = CONCAT44(iStack_c3c,iStack_c40);
      local_408 = local_9e8;
      lStack_400 = lStack_9e0;
      local_c68 = local_c48 + (int)local_3e8;
      iStack_c64 = iStack_c44 + local_3e8._4_4_;
      iStack_c60 = iStack_c40 + (int)uStack_3e0;
      iStack_c5c = iStack_c3c + uStack_3e0._4_4_;
      local_548 = uVar21;
      uStack_540 = uVar19;
      local_3e8 = lVar22;
      uStack_3e0 = lVar23;
      local_3c8 = uVar20;
      uStack_3c0 = uVar24;
      if (local_930 - local_95c < 8) {
        if (local_960 == 0) {
          local_2a8 = CONCAT44(iStack_c54,local_c58);
          uStack_2a0 = CONCAT44(iStack_c4c,iStack_c50);
          auVar14._8_8_ = uStack_2a0;
          auVar14._0_8_ = local_2a8;
          auVar13._8_8_ = uStack_2a0;
          auVar13._0_8_ = local_2a8;
          local_d38 = packusdw(auVar14,auVar13);
          local_2c8 = CONCAT44(iStack_c64,local_c68);
          uStack_2c0 = CONCAT44(iStack_c5c,iStack_c60);
          auVar12._8_8_ = uStack_2c0;
          auVar12._0_8_ = local_2c8;
          auVar11._8_8_ = uStack_2c0;
          auVar11._0_8_ = local_2c8;
          local_d48 = packusdw(auVar12,auVar11);
          local_190 = (undefined8 *)(local_940 + (long)(local_958 * local_944 + local_95c) * 2);
          local_1a8 = local_d38._0_8_;
          uStack_1a0 = local_d38._8_8_;
          *local_190 = local_d38._0_8_;
          local_1b0 = (undefined8 *)
                      (local_940 + (long)(local_958 * local_944 + local_95c + local_944) * 2);
          local_1c8 = local_d48._0_8_;
          uStack_1c0 = local_d48._8_8_;
          *local_1b0 = local_d48._0_8_;
          local_2b8 = local_2c8;
          uStack_2b0 = uStack_2c0;
          local_298 = local_2a8;
          uStack_290 = uStack_2a0;
        }
        else {
          local_350 = (undefined8 *)(local_940 + (long)(local_958 * local_944 + local_95c) * 2);
          local_c78 = *local_350;
          uStack_360 = 0;
          uStack_c70 = 0;
          local_370 = (undefined8 *)
                      (local_940 + (long)(local_958 * local_944 + local_95c + local_944) * 2);
          local_c88 = *local_370;
          uStack_380 = 0;
          uStack_c80 = 0;
          uStack_7d0 = 0;
          local_7e8 = local_a28;
          uVar19 = local_7e8;
          uStack_7e0 = uStack_a20;
          local_7d8._0_2_ = (undefined2)local_c78;
          local_7d8._2_2_ = (undefined2)((ulong)local_c78 >> 0x10);
          local_7d8._4_2_ = (undefined2)((ulong)local_c78 >> 0x20);
          local_7d8._6_2_ = (undefined2)((ulong)local_c78 >> 0x30);
          local_7e8._0_2_ = (undefined2)local_a28;
          local_7e8._2_2_ = (undefined2)((ulong)local_a28 >> 0x10);
          local_7e8._4_2_ = (undefined2)((ulong)local_a28 >> 0x20);
          local_7e8._6_2_ = (undefined2)((ulong)local_a28 >> 0x30);
          local_c98 = (undefined2)local_7d8;
          uStack_c96 = (undefined2)local_7e8;
          uStack_c94 = local_7d8._2_2_;
          uStack_c92 = local_7e8._2_2_;
          uStack_c90 = local_7d8._4_2_;
          uStack_c8e = local_7e8._4_2_;
          uStack_c8c = local_7d8._6_2_;
          uStack_c8a = local_7e8._6_2_;
          uStack_7f0 = 0;
          local_808 = local_a28;
          uStack_800 = uStack_a20;
          local_7f8._0_2_ = (undefined2)local_c88;
          local_7f8._2_2_ = (undefined2)((ulong)local_c88 >> 0x10);
          local_7f8._4_2_ = (undefined2)((ulong)local_c88 >> 0x20);
          local_7f8._6_2_ = (undefined2)((ulong)local_c88 >> 0x30);
          local_ca8 = (undefined2)local_7f8;
          uStack_ca6 = (undefined2)local_7e8;
          uStack_ca4 = local_7f8._2_2_;
          uStack_ca2 = local_7e8._2_2_;
          uStack_ca0 = local_7f8._4_2_;
          uStack_c9e = local_7e8._4_2_;
          uStack_c9c = local_7f8._6_2_;
          uStack_c9a = local_7e8._6_2_;
          local_7f8 = local_c88;
          local_7e8 = uVar19;
          local_7d8 = local_c78;
          local_388 = local_c88;
          local_368 = local_c78;
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_c98,(__m128i *)&local_c58,(__m128i *)&local_988,
                     (__m128i *)&local_998,local_964);
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_ca8,(__m128i *)&local_c68,(__m128i *)&local_988,
                     (__m128i *)&local_998,local_964);
          offset_const_00 = (__m128i *)&local_9e8;
          round_const = (__m128i *)&local_a08;
          highbd_convolve_rounding_sse2(&local_cb8,offset_const_00,round_const,local_9ec);
          local_cd8 = extraout_XMM0_Qa_01;
          uStack_cd0 = extraout_XMM0_Qb_01;
          highbd_convolve_rounding_sse2(&local_cc8,offset_const_00,round_const,local_9ec);
          local_258 = local_cd8;
          uStack_250 = uStack_cd0;
          local_268 = local_cd8;
          uStack_260 = uStack_cd0;
          auVar18._8_8_ = uStack_cd0;
          auVar18._0_8_ = local_cd8;
          auVar17._8_8_ = uStack_cd0;
          auVar17._0_8_ = local_cd8;
          local_cf8 = packusdw(auVar18,auVar17);
          local_1d8 = local_cf8._0_8_;
          uVar26 = local_1d8;
          uStack_1d0 = local_cf8._8_8_;
          uVar27 = uStack_1d0;
          local_1e8 = local_a18;
          uVar24 = local_1e8;
          uStack_1e0 = uStack_a10;
          uVar25 = uStack_1e0;
          local_1d8._0_2_ = local_cf8._0_2_;
          local_1d8._2_2_ = local_cf8._2_2_;
          local_1d8._4_2_ = local_cf8._4_2_;
          local_1d8._6_2_ = local_cf8._6_2_;
          uStack_1d0._0_2_ = local_cf8._8_2_;
          uStack_1d0._2_2_ = local_cf8._10_2_;
          uStack_1d0._4_2_ = local_cf8._12_2_;
          uStack_1d0._6_2_ = local_cf8._14_2_;
          local_1e8._0_2_ = (short)local_a18;
          local_1e8._2_2_ = (short)((ulong)local_a18 >> 0x10);
          local_1e8._4_2_ = (short)((ulong)local_a18 >> 0x20);
          local_1e8._6_2_ = (short)((ulong)local_a18 >> 0x30);
          uStack_1e0._0_2_ = (short)uStack_a10;
          uStack_1e0._2_2_ = (short)((ulong)uStack_a10 >> 0x10);
          uStack_1e0._4_2_ = (short)((ulong)uStack_a10 >> 0x20);
          uStack_1e0._6_2_ = (short)((ulong)uStack_a10 >> 0x30);
          local_d08 = (ushort)((short)local_1e8 < (short)local_1d8) * (short)local_1e8 |
                      (ushort)((short)local_1e8 >= (short)local_1d8) * (short)local_1d8;
          uStack_d06 = (ushort)(local_1e8._2_2_ < local_1d8._2_2_) * local_1e8._2_2_ |
                       (ushort)(local_1e8._2_2_ >= local_1d8._2_2_) * local_1d8._2_2_;
          uStack_d04 = (ushort)(local_1e8._4_2_ < local_1d8._4_2_) * local_1e8._4_2_ |
                       (ushort)(local_1e8._4_2_ >= local_1d8._4_2_) * local_1d8._4_2_;
          uStack_d02 = (ushort)(local_1e8._6_2_ < local_1d8._6_2_) * local_1e8._6_2_ |
                       (ushort)(local_1e8._6_2_ >= local_1d8._6_2_) * local_1d8._6_2_;
          uStack_d00 = (ushort)((short)uStack_1e0 < (short)uStack_1d0) * (short)uStack_1e0 |
                       (ushort)((short)uStack_1e0 >= (short)uStack_1d0) * (short)uStack_1d0;
          uStack_cfe = (ushort)(uStack_1e0._2_2_ < uStack_1d0._2_2_) * uStack_1e0._2_2_ |
                       (ushort)(uStack_1e0._2_2_ >= uStack_1d0._2_2_) * uStack_1d0._2_2_;
          uStack_cfc = (ushort)(uStack_1e0._4_2_ < uStack_1d0._4_2_) * uStack_1e0._4_2_ |
                       (ushort)(uStack_1e0._4_2_ >= uStack_1d0._4_2_) * uStack_1d0._4_2_;
          uStack_cfa = (ushort)(uStack_1e0._6_2_ < uStack_1d0._6_2_) * uStack_1e0._6_2_ |
                       (ushort)(uStack_1e0._6_2_ >= uStack_1d0._6_2_) * uStack_1d0._6_2_;
          auVar16._8_8_ = extraout_XMM0_Qb_02;
          auVar16._0_8_ = extraout_XMM0_Qa_02;
          auVar15._8_8_ = extraout_XMM0_Qb_02;
          auVar15._0_8_ = extraout_XMM0_Qa_02;
          local_d18 = packusdw(auVar16,auVar15);
          local_1f8 = local_d18._0_8_;
          uVar19 = local_1f8;
          uStack_1f0 = local_d18._8_8_;
          uVar20 = uStack_1f0;
          local_208 = local_a18;
          uStack_200 = uStack_a10;
          local_1f8._0_2_ = local_d18._0_2_;
          local_1f8._2_2_ = local_d18._2_2_;
          local_1f8._4_2_ = local_d18._4_2_;
          local_1f8._6_2_ = local_d18._6_2_;
          uStack_1f0._0_2_ = local_d18._8_2_;
          uStack_1f0._2_2_ = local_d18._10_2_;
          uStack_1f0._4_2_ = local_d18._12_2_;
          uStack_1f0._6_2_ = local_d18._14_2_;
          local_d28 = (ushort)((short)local_1e8 < (short)local_1f8) * (short)local_1e8 |
                      (ushort)((short)local_1e8 >= (short)local_1f8) * (short)local_1f8;
          uStack_d26 = (ushort)(local_1e8._2_2_ < local_1f8._2_2_) * local_1e8._2_2_ |
                       (ushort)(local_1e8._2_2_ >= local_1f8._2_2_) * local_1f8._2_2_;
          uStack_d24 = (ushort)(local_1e8._4_2_ < local_1f8._4_2_) * local_1e8._4_2_ |
                       (ushort)(local_1e8._4_2_ >= local_1f8._4_2_) * local_1f8._4_2_;
          uStack_d22 = (ushort)(local_1e8._6_2_ < local_1f8._6_2_) * local_1e8._6_2_ |
                       (ushort)(local_1e8._6_2_ >= local_1f8._6_2_) * local_1f8._6_2_;
          uStack_d20 = (ushort)((short)uStack_1e0 < (short)uStack_1f0) * (short)uStack_1e0 |
                       (ushort)((short)uStack_1e0 >= (short)uStack_1f0) * (short)uStack_1f0;
          uStack_d1e = (ushort)(uStack_1e0._2_2_ < uStack_1f0._2_2_) * uStack_1e0._2_2_ |
                       (ushort)(uStack_1e0._2_2_ >= uStack_1f0._2_2_) * uStack_1f0._2_2_;
          uStack_d1c = (ushort)(uStack_1e0._4_2_ < uStack_1f0._4_2_) * uStack_1e0._4_2_ |
                       (ushort)(uStack_1e0._4_2_ >= uStack_1f0._4_2_) * uStack_1f0._4_2_;
          uStack_d1a = (ushort)(uStack_1e0._6_2_ < uStack_1f0._6_2_) * uStack_1e0._6_2_ |
                       (ushort)(uStack_1e0._6_2_ >= uStack_1f0._6_2_) * uStack_1f0._6_2_;
          local_150 = (undefined8 *)(local_928 + (long)(local_958 * local_92c + local_95c) * 2);
          local_168 = CONCAT26(uStack_d02,CONCAT24(uStack_d04,CONCAT22(uStack_d06,local_d08)));
          uStack_160 = CONCAT26(uStack_cfa,CONCAT24(uStack_cfc,CONCAT22(uStack_cfe,uStack_d00)));
          *local_150 = local_168;
          local_170 = (undefined8 *)
                      (local_928 + (long)(local_958 * local_92c + local_95c + local_92c) * 2);
          local_188 = CONCAT26(uStack_d22,CONCAT24(uStack_d24,CONCAT22(uStack_d26,local_d28)));
          uStack_180 = CONCAT26(uStack_d1a,CONCAT24(uStack_d1c,CONCAT22(uStack_d1e,uStack_d20)));
          *local_170 = local_188;
          local_1f8 = uVar19;
          uStack_1f0 = uVar20;
          local_1e8 = uVar24;
          uStack_1e0 = uVar25;
          local_1d8 = uVar26;
          uStack_1d0 = uVar27;
        }
      }
      else {
        convolve((__m128i *)&local_ae8,(__m128i *)local_b68);
        local_568 = local_9c8;
        uVar21 = local_568;
        uStack_560 = uStack_9c0;
        uVar19 = uStack_560;
        local_558 = (int)extraout_XMM0_Qa_03;
        iStack_554 = (int)((ulong)extraout_XMM0_Qa_03 >> 0x20);
        iStack_550 = (int)extraout_XMM0_Qb_03;
        iStack_54c = (int)((ulong)extraout_XMM0_Qb_03 >> 0x20);
        local_568._0_4_ = (int)local_9c8;
        local_568._4_4_ = (int)(local_9c8 >> 0x20);
        uStack_560._0_4_ = (int)uStack_9c0;
        uStack_560._4_4_ = (int)((ulong)uStack_9c0 >> 0x20);
        local_418 = CONCAT44(iStack_554 << local_568._4_4_,local_558 << (int)local_568);
        uStack_410 = CONCAT44(iStack_54c << uStack_560._4_4_,iStack_550 << (int)uStack_560);
        local_428 = local_9a8;
        uVar20 = local_428;
        uStack_420 = uStack_9a0;
        uVar24 = uStack_420;
        local_428._0_4_ = (int)local_9a8;
        local_428._4_4_ = (int)((ulong)local_9a8 >> 0x20);
        uStack_420._0_4_ = (int)uStack_9a0;
        uStack_420._4_4_ = (int)((ulong)uStack_9a0 >> 0x20);
        local_4d8 = (local_558 << (int)local_568) + (int)local_428;
        iStack_4d4 = (iStack_554 << local_568._4_4_) + local_428._4_4_;
        iStack_4d0 = (iStack_550 << (int)uStack_560) + (int)uStack_420;
        iStack_4cc = (iStack_54c << uStack_560._4_4_) + uStack_420._4_4_;
        local_4e8 = local_9b8;
        uStack_4e0 = uStack_9b0;
        auVar2._8_8_ = uStack_9b0;
        auVar2._0_8_ = local_9b8;
        local_d68 = local_4d8 >> auVar2;
        iStack_d64 = iStack_4d4 >> auVar2;
        iStack_d60 = iStack_4d0 >> auVar2;
        iStack_d5c = iStack_4cc >> auVar2;
        local_568 = uVar21;
        uStack_560 = uVar19;
        local_428 = uVar20;
        uStack_420 = uVar24;
        convolve((__m128i *)&local_a68,(__m128i *)local_b68);
        local_588 = local_9c8;
        uVar21 = local_588;
        uStack_580 = uStack_9c0;
        uVar19 = uStack_580;
        local_578 = (int)extraout_XMM0_Qa_04;
        iStack_574 = (int)((ulong)extraout_XMM0_Qa_04 >> 0x20);
        iStack_570 = (int)extraout_XMM0_Qb_04;
        iStack_56c = (int)((ulong)extraout_XMM0_Qb_04 >> 0x20);
        local_588._0_4_ = (int)local_9c8;
        local_588._4_4_ = (int)(local_9c8 >> 0x20);
        uStack_580._0_4_ = (int)uStack_9c0;
        uStack_580._4_4_ = (int)((ulong)uStack_9c0 >> 0x20);
        local_438 = CONCAT44(iStack_574 << local_588._4_4_,local_578 << (int)local_588);
        uStack_430 = CONCAT44(iStack_56c << uStack_580._4_4_,iStack_570 << (int)uStack_580);
        local_448 = local_9a8;
        uVar20 = local_448;
        uStack_440 = uStack_9a0;
        uVar24 = uStack_440;
        local_448._0_4_ = (int)local_9a8;
        local_448._4_4_ = (int)((ulong)local_9a8 >> 0x20);
        uStack_440._0_4_ = (int)uStack_9a0;
        uStack_440._4_4_ = (int)((ulong)uStack_9a0 >> 0x20);
        local_4f8 = (local_578 << (int)local_588) + (int)local_448;
        iStack_4f4 = (iStack_574 << local_588._4_4_) + local_448._4_4_;
        iStack_4f0 = (iStack_570 << (int)uStack_580) + (int)uStack_440;
        iStack_4ec = (iStack_56c << uStack_580._4_4_) + uStack_440._4_4_;
        local_508 = local_9b8;
        uStack_500 = uStack_9b0;
        auVar1._8_8_ = uStack_9b0;
        auVar1._0_8_ = local_9b8;
        local_d88 = local_4f8 >> auVar1;
        iStack_d84 = iStack_4f4 >> auVar1;
        iStack_d80 = iStack_4f0 >> auVar1;
        iStack_d7c = iStack_4ec >> auVar1;
        local_458 = CONCAT44(iStack_d64,local_d68);
        uStack_450 = CONCAT44(iStack_d5c,iStack_d60);
        local_468 = local_9e8;
        lVar22 = local_468;
        uStack_460 = lStack_9e0;
        lVar23 = uStack_460;
        local_468._0_4_ = (int)local_9e8;
        local_468._4_4_ = (int)((ulong)local_9e8 >> 0x20);
        uStack_460._0_4_ = (int)lStack_9e0;
        uStack_460._4_4_ = (int)((ulong)lStack_9e0 >> 0x20);
        local_d98 = local_d68 + (int)local_468;
        iStack_d94 = iStack_d64 + local_468._4_4_;
        iStack_d90 = iStack_d60 + (int)uStack_460;
        iStack_d8c = iStack_d5c + uStack_460._4_4_;
        local_478 = CONCAT44(iStack_d84,local_d88);
        uStack_470 = CONCAT44(iStack_d7c,iStack_d80);
        local_488 = local_9e8;
        lStack_480 = lStack_9e0;
        local_da8 = local_d88 + (int)local_468;
        iStack_da4 = iStack_d84 + local_468._4_4_;
        iStack_da0 = iStack_d80 + (int)uStack_460;
        iStack_d9c = iStack_d7c + uStack_460._4_4_;
        local_588 = uVar21;
        uStack_580 = uVar19;
        local_468 = lVar22;
        uStack_460 = lVar23;
        local_448 = uVar20;
        uStack_440 = uVar24;
        if (local_960 == 0) {
          local_318 = CONCAT44(iStack_c54,local_c58);
          uStack_310 = CONCAT44(iStack_c4c,iStack_c50);
          local_328 = CONCAT44(iStack_d94,local_d98);
          uStack_320 = CONCAT44(iStack_d8c,iStack_d90);
          auVar6._8_8_ = uStack_310;
          auVar6._0_8_ = local_318;
          auVar5._8_8_ = uStack_320;
          auVar5._0_8_ = local_328;
          auVar28 = packusdw(auVar6,auVar5);
          local_338 = CONCAT44(iStack_c64,local_c68);
          uStack_330 = CONCAT44(iStack_c5c,iStack_c60);
          local_348 = CONCAT44(iStack_da4,local_da8);
          uStack_340 = CONCAT44(iStack_d9c,iStack_da0);
          auVar4._8_8_ = uStack_330;
          auVar4._0_8_ = local_338;
          auVar3._8_8_ = uStack_340;
          auVar3._0_8_ = local_348;
          auVar29 = packusdw(auVar4,auVar3);
          local_110 = (undefined8 *)(local_940 + (long)(local_958 * local_944 + local_95c) * 2);
          local_ed8 = auVar28._0_8_;
          uStack_ed0 = auVar28._8_8_;
          local_128 = local_ed8;
          uStack_120 = uStack_ed0;
          *local_110 = local_ed8;
          local_110[1] = uStack_ed0;
          local_130 = (undefined8 *)
                      (local_940 + (long)(local_958 * local_944 + local_95c + local_944) * 2);
          local_ee8 = auVar29._0_8_;
          uStack_ee0 = auVar29._8_8_;
          local_148 = local_ee8;
          uStack_140 = uStack_ee0;
          *local_130 = local_ee8;
          local_130[1] = uStack_ee0;
        }
        else {
          local_898 = (undefined8 *)(local_940 + (long)(local_958 * local_944 + local_95c) * 2);
          local_db8 = *local_898;
          uStack_db0 = local_898[1];
          local_8a0 = (undefined8 *)
                      (local_940 + (long)(local_958 * local_944 + local_95c + local_944) * 2);
          local_dc8 = *local_8a0;
          uStack_dc0 = local_8a0[1];
          local_828 = local_a28;
          uVar19 = local_828;
          uStack_820 = uStack_a20;
          local_818._0_2_ = (undefined2)local_db8;
          local_818._2_2_ = (undefined2)((ulong)local_db8 >> 0x10);
          local_818._4_2_ = (undefined2)((ulong)local_db8 >> 0x20);
          local_818._6_2_ = (undefined2)((ulong)local_db8 >> 0x30);
          local_828._0_2_ = (undefined2)local_a28;
          local_828._2_2_ = (undefined2)((ulong)local_a28 >> 0x10);
          local_828._4_2_ = (undefined2)((ulong)local_a28 >> 0x20);
          local_828._6_2_ = (undefined2)((ulong)local_a28 >> 0x30);
          local_dd8 = (undefined2)local_818;
          uStack_dd6 = (undefined2)local_828;
          uStack_dd4 = local_818._2_2_;
          uStack_dd2 = local_828._2_2_;
          uStack_dd0 = local_818._4_2_;
          uStack_dce = local_828._4_2_;
          uStack_dcc = local_818._6_2_;
          uStack_dca = local_828._6_2_;
          local_848 = local_a28;
          uStack_840 = uStack_a20;
          local_838._0_2_ = (undefined2)local_dc8;
          local_838._2_2_ = (undefined2)((ulong)local_dc8 >> 0x10);
          local_838._4_2_ = (undefined2)((ulong)local_dc8 >> 0x20);
          local_838._6_2_ = (undefined2)((ulong)local_dc8 >> 0x30);
          local_de8 = (undefined2)local_838;
          uStack_de6 = (undefined2)local_828;
          uStack_de4 = local_838._2_2_;
          uStack_de2 = local_828._2_2_;
          uStack_de0 = local_838._4_2_;
          uStack_dde = local_828._4_2_;
          uStack_ddc = local_838._6_2_;
          uStack_dda = local_828._6_2_;
          local_6a8 = local_a28;
          uStack_6a0 = uStack_a20;
          uVar20 = uStack_6a0;
          uStack_690._0_2_ = (undefined2)uStack_db0;
          uStack_690._2_2_ = (undefined2)((ulong)uStack_db0 >> 0x10);
          uStack_690._4_2_ = (undefined2)((ulong)uStack_db0 >> 0x20);
          uStack_690._6_2_ = (undefined2)((ulong)uStack_db0 >> 0x30);
          uStack_6a0._0_2_ = (undefined2)uStack_a20;
          uStack_6a0._2_2_ = (undefined2)((ulong)uStack_a20 >> 0x10);
          uStack_6a0._4_2_ = (undefined2)((ulong)uStack_a20 >> 0x20);
          uStack_6a0._6_2_ = (undefined2)((ulong)uStack_a20 >> 0x30);
          local_df8 = (undefined2)uStack_690;
          uStack_df6 = (undefined2)uStack_6a0;
          uStack_df4 = uStack_690._2_2_;
          uStack_df2 = uStack_6a0._2_2_;
          uStack_df0 = uStack_690._4_2_;
          uStack_dee = uStack_6a0._4_2_;
          uStack_dec = uStack_690._6_2_;
          uStack_dea = uStack_6a0._6_2_;
          local_6c8 = local_a28;
          uStack_6c0 = uStack_a20;
          uStack_6b0._0_2_ = (undefined2)uStack_dc0;
          uStack_6b0._2_2_ = (undefined2)((ulong)uStack_dc0 >> 0x10);
          uStack_6b0._4_2_ = (undefined2)((ulong)uStack_dc0 >> 0x20);
          uStack_6b0._6_2_ = (undefined2)((ulong)uStack_dc0 >> 0x30);
          local_e08 = (undefined2)uStack_6b0;
          uStack_e06 = (undefined2)uStack_6a0;
          uStack_e04 = uStack_6b0._2_2_;
          uStack_e02 = uStack_6a0._2_2_;
          uStack_e00 = uStack_6b0._4_2_;
          uStack_dfe = uStack_6a0._4_2_;
          uStack_dfc = uStack_6b0._6_2_;
          uStack_dfa = uStack_6a0._6_2_;
          local_838 = local_dc8;
          uStack_830 = uStack_dc0;
          local_828 = uVar19;
          local_818 = local_db8;
          uStack_810 = uStack_db0;
          local_6b8 = local_dc8;
          uStack_6b0 = uStack_dc0;
          uStack_6a0 = uVar20;
          local_698 = local_db8;
          uStack_690 = uStack_db0;
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_dd8,(__m128i *)&local_c58,(__m128i *)&local_988,
                     (__m128i *)&local_998,local_964);
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_de8,(__m128i *)&local_c68,(__m128i *)&local_988,
                     (__m128i *)&local_998,local_964);
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_df8,(__m128i *)&local_d98,(__m128i *)&local_988,
                     (__m128i *)&local_998,local_964);
          highbd_comp_avg_sse4_1
                    ((__m128i *)&local_e08,(__m128i *)&local_da8,(__m128i *)&local_988,
                     (__m128i *)&local_998,local_964);
          highbd_convolve_rounding_sse2
                    (&local_e18,(__m128i *)&local_9e8,(__m128i *)&local_a08,local_9ec);
          highbd_convolve_rounding_sse2
                    (&local_e28,(__m128i *)&local_9e8,(__m128i *)&local_a08,local_9ec);
          highbd_convolve_rounding_sse2
                    (&local_e38,(__m128i *)&local_9e8,(__m128i *)&local_a08,local_9ec);
          highbd_convolve_rounding_sse2
                    (&local_e48,(__m128i *)&local_9e8,(__m128i *)&local_a08,local_9ec);
          auVar10._8_8_ = extraout_XMM0_Qb_05;
          auVar10._0_8_ = extraout_XMM0_Qa_05;
          auVar9._8_8_ = extraout_XMM0_Qb_07;
          auVar9._0_8_ = extraout_XMM0_Qa_07;
          auVar28 = packusdw(auVar10,auVar9);
          local_e98 = auVar28._0_8_;
          uStack_e90 = auVar28._8_8_;
          local_218 = local_e98;
          uVar26 = local_218;
          uStack_210 = uStack_e90;
          uVar27 = uStack_210;
          local_228 = local_a18;
          uVar24 = local_228;
          uStack_220 = uStack_a10;
          uVar25 = uStack_220;
          local_218._0_2_ = auVar28._0_2_;
          local_218._2_2_ = auVar28._2_2_;
          local_218._4_2_ = auVar28._4_2_;
          local_218._6_2_ = auVar28._6_2_;
          uStack_210._0_2_ = auVar28._8_2_;
          uStack_210._2_2_ = auVar28._10_2_;
          uStack_210._4_2_ = auVar28._12_2_;
          uStack_210._6_2_ = auVar28._14_2_;
          local_228._0_2_ = (short)local_a18;
          local_228._2_2_ = (short)((ulong)local_a18 >> 0x10);
          local_228._4_2_ = (short)((ulong)local_a18 >> 0x20);
          local_228._6_2_ = (short)((ulong)local_a18 >> 0x30);
          uStack_220._0_2_ = (short)uStack_a10;
          uStack_220._2_2_ = (short)((ulong)uStack_a10 >> 0x10);
          uStack_220._4_2_ = (short)((ulong)uStack_a10 >> 0x20);
          uStack_220._6_2_ = (short)((ulong)uStack_a10 >> 0x30);
          auVar8._8_8_ = extraout_XMM0_Qb_06;
          auVar8._0_8_ = extraout_XMM0_Qa_06;
          auVar7._8_8_ = extraout_XMM0_Qb_08;
          auVar7._0_8_ = extraout_XMM0_Qa_08;
          auVar28 = packusdw(auVar8,auVar7);
          local_eb8 = auVar28._0_8_;
          uStack_eb0 = auVar28._8_8_;
          local_238 = local_eb8;
          uVar19 = local_238;
          uStack_230 = uStack_eb0;
          uVar20 = uStack_230;
          local_248 = local_a18;
          uStack_240 = uStack_a10;
          local_238._0_2_ = auVar28._0_2_;
          local_238._2_2_ = auVar28._2_2_;
          local_238._4_2_ = auVar28._4_2_;
          local_238._6_2_ = auVar28._6_2_;
          uStack_230._0_2_ = auVar28._8_2_;
          uStack_230._2_2_ = auVar28._10_2_;
          uStack_230._4_2_ = auVar28._12_2_;
          uStack_230._6_2_ = auVar28._14_2_;
          local_d0 = (undefined8 *)(local_928 + (long)(local_958 * local_92c + local_95c) * 2);
          local_e8 = CONCAT26((ushort)(local_228._6_2_ < local_218._6_2_) * local_228._6_2_ |
                              (ushort)(local_228._6_2_ >= local_218._6_2_) * local_218._6_2_,
                              CONCAT24((ushort)(local_228._4_2_ < local_218._4_2_) * local_228._4_2_
                                       | (ushort)(local_228._4_2_ >= local_218._4_2_) *
                                         local_218._4_2_,
                                       CONCAT22((ushort)(local_228._2_2_ < local_218._2_2_) *
                                                local_228._2_2_ |
                                                (ushort)(local_228._2_2_ >= local_218._2_2_) *
                                                local_218._2_2_,
                                                (ushort)((short)local_228 < (short)local_218) *
                                                (short)local_228 |
                                                (ushort)((short)local_228 >= (short)local_218) *
                                                (short)local_218)));
          uStack_e0 = CONCAT26((ushort)(uStack_220._6_2_ < uStack_210._6_2_) * uStack_220._6_2_ |
                               (ushort)(uStack_220._6_2_ >= uStack_210._6_2_) * uStack_210._6_2_,
                               CONCAT24((ushort)(uStack_220._4_2_ < uStack_210._4_2_) *
                                        uStack_220._4_2_ |
                                        (ushort)(uStack_220._4_2_ >= uStack_210._4_2_) *
                                        uStack_210._4_2_,
                                        CONCAT22((ushort)(uStack_220._2_2_ < uStack_210._2_2_) *
                                                 uStack_220._2_2_ |
                                                 (ushort)(uStack_220._2_2_ >= uStack_210._2_2_) *
                                                 uStack_210._2_2_,
                                                 (ushort)((short)uStack_220 < (short)uStack_210) *
                                                 (short)uStack_220 |
                                                 (ushort)((short)uStack_220 >= (short)uStack_210) *
                                                 (short)uStack_210)));
          *local_d0 = local_e8;
          local_d0[1] = uStack_e0;
          local_f0 = (undefined8 *)
                     (local_928 + (long)(local_958 * local_92c + local_95c + local_92c) * 2);
          local_108 = CONCAT26((ushort)(local_228._6_2_ < local_238._6_2_) * local_228._6_2_ |
                               (ushort)(local_228._6_2_ >= local_238._6_2_) * local_238._6_2_,
                               CONCAT24((ushort)(local_228._4_2_ < local_238._4_2_) *
                                        local_228._4_2_ |
                                        (ushort)(local_228._4_2_ >= local_238._4_2_) *
                                        local_238._4_2_,
                                        CONCAT22((ushort)(local_228._2_2_ < local_238._2_2_) *
                                                 local_228._2_2_ |
                                                 (ushort)(local_228._2_2_ >= local_238._2_2_) *
                                                 local_238._2_2_,
                                                 (ushort)((short)local_228 < (short)local_238) *
                                                 (short)local_228 |
                                                 (ushort)((short)local_228 >= (short)local_238) *
                                                 (short)local_238)));
          uStack_100 = CONCAT26((ushort)(uStack_220._6_2_ < uStack_230._6_2_) * uStack_220._6_2_ |
                                (ushort)(uStack_220._6_2_ >= uStack_230._6_2_) * uStack_230._6_2_,
                                CONCAT24((ushort)(uStack_220._4_2_ < uStack_230._4_2_) *
                                         uStack_220._4_2_ |
                                         (ushort)(uStack_220._4_2_ >= uStack_230._4_2_) *
                                         uStack_230._4_2_,
                                         CONCAT22((ushort)(uStack_220._2_2_ < uStack_230._2_2_) *
                                                  uStack_220._2_2_ |
                                                  (ushort)(uStack_220._2_2_ >= uStack_230._2_2_) *
                                                  uStack_230._2_2_,
                                                  (ushort)((short)uStack_220 < (short)uStack_230) *
                                                  (short)uStack_220 |
                                                  (ushort)((short)uStack_220 >= (short)uStack_230) *
                                                  (short)uStack_230)));
          *local_f0 = local_108;
          local_f0[1] = uStack_100;
          local_238 = uVar19;
          uStack_230 = uVar20;
          local_228 = uVar24;
          uStack_220 = uVar25;
          local_218 = uVar26;
          uStack_210 = uVar27;
        }
      }
      local_b28 = local_b18;
      uStack_b20 = uStack_b10;
      local_b18 = local_b08;
      uStack_b10 = uStack_b00;
      local_b08 = CONCAT26(uStack_af2,CONCAT24(uStack_af4,CONCAT22(uStack_af6,local_af8)));
      uStack_b00 = CONCAT26(uStack_aea,CONCAT24(uStack_aec,CONCAT22(uStack_aee,uStack_af0)));
      local_ae8 = local_ad8;
      uStack_ae0 = uStack_ad0;
      local_ad8 = local_ac8;
      uStack_ad0 = uStack_ac0;
      local_ac8 = CONCAT26(uStack_ab2,CONCAT24(uStack_ab4,CONCAT22(uStack_ab6,local_ab8)));
      uStack_ac0 = CONCAT26(uStack_aaa,CONCAT24(uStack_aac,CONCAT22(uStack_aae,uStack_ab0)));
      local_aa8 = local_a98;
      uStack_aa0 = uStack_a90;
      local_a98 = local_a88;
      uStack_a90 = uStack_a80;
      local_a88 = CONCAT26(uStack_a72,CONCAT24(uStack_a74,CONCAT22(uStack_a76,local_a78)));
      uStack_a80 = CONCAT26(uStack_a6a,CONCAT24(uStack_a6c,CONCAT22(uStack_a6e,uStack_a70)));
      local_a68 = local_a58;
      uStack_a60 = uStack_a50;
      local_a58 = local_a48;
      uStack_a50 = uStack_a40;
      local_a48 = CONCAT26(uStack_a32,CONCAT24(uStack_a34,CONCAT22(uStack_a36,local_a38)));
      uStack_a40 = CONCAT26(uStack_a2a,CONCAT24(uStack_a2c,CONCAT22(uStack_a2e,uStack_a30)));
      local_be8 = local_c08;
      uStack_be0 = uStack_c00;
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_y_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_y, const int subpel_y_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  int i, j;
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);
  const __m128i round_const_y =
      _mm_set1_epi32(((1 << conv_params->round_1) >> 1));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i zero = _mm_setzero_si128();
  __m128i s[16], coeffs_y[4];

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    const uint16_t *data = &src_ptr[j];
    /* Vertical filter */
    {
      __m128i s0 = _mm_loadu_si128((__m128i *)(data + 0 * src_stride));
      __m128i s1 = _mm_loadu_si128((__m128i *)(data + 1 * src_stride));
      __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_stride));
      __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_stride));
      __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_stride));
      __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_stride));
      __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_stride));

      s[0] = _mm_unpacklo_epi16(s0, s1);
      s[1] = _mm_unpacklo_epi16(s2, s3);
      s[2] = _mm_unpacklo_epi16(s4, s5);

      s[4] = _mm_unpackhi_epi16(s0, s1);
      s[5] = _mm_unpackhi_epi16(s2, s3);
      s[6] = _mm_unpackhi_epi16(s4, s5);

      s[0 + 8] = _mm_unpacklo_epi16(s1, s2);
      s[1 + 8] = _mm_unpacklo_epi16(s3, s4);
      s[2 + 8] = _mm_unpacklo_epi16(s5, s6);

      s[4 + 8] = _mm_unpackhi_epi16(s1, s2);
      s[5 + 8] = _mm_unpackhi_epi16(s3, s4);
      s[6 + 8] = _mm_unpackhi_epi16(s5, s6);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        __m128i s7 = _mm_loadu_si128((__m128i *)(data + 7 * src_stride));
        __m128i s8 = _mm_loadu_si128((__m128i *)(data + 8 * src_stride));

        s[3] = _mm_unpacklo_epi16(s6, s7);
        s[7] = _mm_unpackhi_epi16(s6, s7);

        s[3 + 8] = _mm_unpacklo_epi16(s7, s8);
        s[7 + 8] = _mm_unpackhi_epi16(s7, s8);

        const __m128i res_a0 = convolve(s, coeffs_y);
        __m128i res_a_round0 = _mm_sll_epi32(res_a0, round_shift_bits);
        res_a_round0 = _mm_sra_epi32(_mm_add_epi32(res_a_round0, round_const_y),
                                     round_shift_y);

        const __m128i res_a1 = convolve(s + 8, coeffs_y);
        __m128i res_a_round1 = _mm_sll_epi32(res_a1, round_shift_bits);
        res_a_round1 = _mm_sra_epi32(_mm_add_epi32(res_a_round1, round_const_y),
                                     round_shift_y);

        __m128i res_unsigned_lo_0 = _mm_add_epi32(res_a_round0, offset_const);
        __m128i res_unsigned_lo_1 = _mm_add_epi32(res_a_round1, offset_const);

        if (w - j < 8) {
          if (do_average) {
            const __m128i data_0 =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
            const __m128i data_1 = _mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride]));

            const __m128i data_ref_0 = _mm_unpacklo_epi16(data_0, zero);
            const __m128i data_ref_1 = _mm_unpacklo_epi16(data_1, zero);

            const __m128i comp_avg_res_0 =
                highbd_comp_avg_sse4_1(&data_ref_0, &res_unsigned_lo_0, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_1 =
                highbd_comp_avg_sse4_1(&data_ref_1, &res_unsigned_lo_1, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result_0 =
                highbd_convolve_rounding_sse2(&comp_avg_res_0, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_1 =
                highbd_convolve_rounding_sse2(&comp_avg_res_1, &offset_const,
                                              &rounding_const, rounding_shift);

            const __m128i res_16b_0 =
                _mm_packus_epi32(round_result_0, round_result_0);
            const __m128i res_clip_0 =
                _mm_min_epi16(res_16b_0, clip_pixel_to_bd);
            const __m128i res_16b_1 =
                _mm_packus_epi32(round_result_1, round_result_1);
            const __m128i res_clip_1 =
                _mm_min_epi16(res_16b_1, clip_pixel_to_bd);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]),
                             res_clip_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]),
                res_clip_1);

          } else {
            __m128i res_16b_0 =
                _mm_packus_epi32(res_unsigned_lo_0, res_unsigned_lo_0);

            __m128i res_16b_1 =
                _mm_packus_epi32(res_unsigned_lo_1, res_unsigned_lo_1);

            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_16b_0);
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                             res_16b_1);
          }
        } else {
          const __m128i res_b0 = convolve(s + 4, coeffs_y);
          __m128i res_b_round0 = _mm_sll_epi32(res_b0, round_shift_bits);
          res_b_round0 = _mm_sra_epi32(
              _mm_add_epi32(res_b_round0, round_const_y), round_shift_y);

          const __m128i res_b1 = convolve(s + 4 + 8, coeffs_y);
          __m128i res_b_round1 = _mm_sll_epi32(res_b1, round_shift_bits);
          res_b_round1 = _mm_sra_epi32(
              _mm_add_epi32(res_b_round1, round_const_y), round_shift_y);

          __m128i res_unsigned_hi_0 = _mm_add_epi32(res_b_round0, offset_const);
          __m128i res_unsigned_hi_1 = _mm_add_epi32(res_b_round1, offset_const);

          if (do_average) {
            const __m128i data_0 =
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));
            const __m128i data_1 = _mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride]));
            const __m128i data_ref_0_lo_0 = _mm_unpacklo_epi16(data_0, zero);
            const __m128i data_ref_0_lo_1 = _mm_unpacklo_epi16(data_1, zero);

            const __m128i data_ref_0_hi_0 = _mm_unpackhi_epi16(data_0, zero);
            const __m128i data_ref_0_hi_1 = _mm_unpackhi_epi16(data_1, zero);

            const __m128i comp_avg_res_lo_0 =
                highbd_comp_avg_sse4_1(&data_ref_0_lo_0, &res_unsigned_lo_0,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_lo_1 =
                highbd_comp_avg_sse4_1(&data_ref_0_lo_1, &res_unsigned_lo_1,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_hi_0 =
                highbd_comp_avg_sse4_1(&data_ref_0_hi_0, &res_unsigned_hi_0,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_hi_1 =
                highbd_comp_avg_sse4_1(&data_ref_0_hi_1, &res_unsigned_hi_1,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result_lo_0 =
                highbd_convolve_rounding_sse2(&comp_avg_res_lo_0, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_lo_1 =
                highbd_convolve_rounding_sse2(&comp_avg_res_lo_1, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_hi_0 =
                highbd_convolve_rounding_sse2(&comp_avg_res_hi_0, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_hi_1 =
                highbd_convolve_rounding_sse2(&comp_avg_res_hi_1, &offset_const,
                                              &rounding_const, rounding_shift);

            const __m128i res_16b_0 =
                _mm_packus_epi32(round_result_lo_0, round_result_hi_0);
            const __m128i res_clip_0 =
                _mm_min_epi16(res_16b_0, clip_pixel_to_bd);

            const __m128i res_16b_1 =
                _mm_packus_epi32(round_result_lo_1, round_result_hi_1);
            const __m128i res_clip_1 =
                _mm_min_epi16(res_16b_1, clip_pixel_to_bd);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]),
                            res_clip_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]),
                res_clip_1);
          } else {
            __m128i res_16bit0 =
                _mm_packus_epi32(res_unsigned_lo_0, res_unsigned_hi_0);
            __m128i res_16bit1 =
                _mm_packus_epi32(res_unsigned_lo_1, res_unsigned_hi_1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_16bit0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_16bit1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];

        s[0 + 8] = s[1 + 8];
        s[1 + 8] = s[2 + 8];
        s[2 + 8] = s[3 + 8];

        s[4 + 8] = s[5 + 8];
        s[5 + 8] = s[6 + 8];
        s[6 + 8] = s[7 + 8];

        s6 = s8;
      }
    }
  }
}